

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetArrayItemI_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint index_00;
  code *pcVar1;
  bool bVar2;
  uint offset;
  Var pvVar3;
  JavascriptArray *this_00;
  ScriptContext *pSVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  ScriptContext *scriptContext;
  uint32 index2;
  SparseArraySegment<void_*> *lastUsedSeg;
  Var value;
  uint32 index;
  JavascriptArray *array;
  OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  this_00 = Js::JavascriptArray::FromAnyArray(pvVar3);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
  pSVar5 = GetScriptContext(this);
  if (pSVar4 != pSVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15da,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  index_00 = playout->Element;
  pvVar3 = GetReg<unsigned_int>(this,playout->Value);
  bVar2 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15df,
                                "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(array))",
                                "VirtualTableInfo<JavascriptArray>::HasVirtualTable(array)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar7 = Js::JavascriptArray::GetLastUsedSegment(this_00);
  if ((index_00 < pSVar7->left) || (offset = index_00 - pSVar7->left, pSVar7->size <= offset)) {
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
    Js::JavascriptOperators::SetItem
              (this_00,(RecyclableObject *)this_00,index_00,pvVar3,pSVar4,PropertyOperation_None,0);
  }
  else {
    Js::JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(this_00,offset,pvVar3);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArrayItemI_CI4(const unaligned T* playout)
    {
        // Note that this code assumes that we only get here when we see an array literal,
        // so we know that the instance is truly an array, and the index is a uint32.
        // If/when we use this for cases like "a[0] = x", we'll at least have to check
        // whether "a" is really an array.

        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->Instance));

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());

        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

        Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(array));
        SparseArraySegment<Var>* lastUsedSeg = (SparseArraySegment<Var>*)array->GetLastUsedSegment();
        if (index >= lastUsedSeg->left)
        {
            uint32 index2 = index - lastUsedSeg->left;
            if (index2 < lastUsedSeg->size)
            {
                // Successful fastpath
                array->DirectSetItemInLastUsedSegmentAt(index2, value);
                return;
            }
        }

        ScriptContext* scriptContext = array->GetScriptContext();
        JavascriptOperators::SetItem(array, array, index, value, scriptContext);
    }